

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowAbove(ImGuiWindow *potential_above,ImGuiWindow *potential_below)

{
  ImGuiWindow *pIVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(uint)(GImGui->Windows).Size;
  while( true ) {
    if ((int)uVar2 < 1) {
      return false;
    }
    pIVar1 = (GImGui->Windows).Data[uVar2 - 1];
    if (pIVar1 == potential_above) break;
    uVar2 = uVar2 - 1;
    if (pIVar1 == potential_below) {
      return false;
    }
  }
  return true;
}

Assistant:

bool ImGui::IsWindowAbove(ImGuiWindow* potential_above, ImGuiWindow* potential_below)
{
    ImGuiContext& g = *GImGui;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* candidate_window = g.Windows[i];
        if (candidate_window == potential_above)
            return true;
        if (candidate_window == potential_below)
            return false;
    }
    return false;
}